

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

bool __thiscall slang::ast::AssertionExpr::admitsEmpty(AssertionExpr *this)

{
  bool bVar1;
  AdmitsEmptyVisitor local_11;
  AssertionExpr *pAStack_10;
  AdmitsEmptyVisitor visitor;
  AssertionExpr *this_local;
  
  pAStack_10 = this;
  bVar1 = visit<(anonymous_namespace)::AdmitsEmptyVisitor>(this,&local_11);
  return bVar1;
}

Assistant:

bool AssertionExpr::admitsEmpty() const {
    AdmitsEmptyVisitor visitor;
    return visit(visitor);
}